

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

void __thiscall bssl::TemporaryDirectory::~TemporaryDirectory(TemporaryDirectory *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  string local_50;
  
  if (*(long *)(this + 8) != 0) {
    p_Var2 = *(_Rb_tree_node_base **)(this + 0x38);
    if (p_Var2 != (_Rb_tree_node_base *)(this + 0x28)) {
      do {
        GetFilePath(&local_50,this,(string *)(p_Var2 + 1));
        iVar1 = unlink(local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar1 != 0) {
          perror("Could not delete file");
        }
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      } while (p_Var2 != (_Rb_tree_node_base *)(this + 0x28));
    }
    iVar1 = rmdir(*(char **)this);
    if (iVar1 != 0) {
      perror("Could not delete directory");
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x20));
  if (*(TemporaryDirectory **)this != this + 0x10) {
    operator_delete(*(TemporaryDirectory **)this,*(long *)(this + 0x10) + 1);
  }
  return;
}

Assistant:

TemporaryDirectory::~TemporaryDirectory() {
  if (path_.empty()) {
    return;
  }

#if defined(OPENSSL_WINDOWS)
  for (const auto &file : files_) {
    if (!DeleteFileA(GetFilePath(file).c_str())) {
      PrintLastError("Could not delete file");
    }
  }
  if (!RemoveDirectoryA(path_.c_str())) {
    PrintLastError("Could not delete directory");
  }
#else
  for (const auto &file : files_) {
    if (unlink(GetFilePath(file).c_str()) != 0) {
      perror("Could not delete file");
    }
  }
  if (rmdir(path_.c_str()) != 0) {
    perror("Could not delete directory");
  }
#endif
}